

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbePmaWriteBlob(PmaWriter *p,u8 *pData,int nData)

{
  int amt;
  int iVar1;
  int in_EDX;
  sqlite3_file *in_RSI;
  int *in_RDI;
  bool bVar2;
  int nCopy;
  int nRem;
  i64 in_stack_ffffffffffffffd8;
  int iVar3;
  
  iVar3 = in_EDX;
  while( true ) {
    bVar2 = false;
    if (0 < in_EDX) {
      bVar2 = *in_RDI == 0;
    }
    if (!bVar2) break;
    amt = in_EDX;
    if (in_RDI[4] - in_RDI[6] < in_EDX) {
      amt = in_RDI[4] - in_RDI[6];
    }
    memcpy((void *)(*(long *)(in_RDI + 2) + (long)in_RDI[6]),
           (void *)((long)&in_RSI->pMethods + (long)(iVar3 - in_EDX)),(long)amt);
    in_RDI[6] = amt + in_RDI[6];
    if (in_RDI[6] == in_RDI[4]) {
      iVar1 = sqlite3OsWrite(in_RSI,(void *)CONCAT44(iVar3,in_EDX),amt,in_stack_ffffffffffffffd8);
      *in_RDI = iVar1;
      in_RDI[6] = 0;
      in_RDI[5] = 0;
      *(long *)(in_RDI + 8) = (long)in_RDI[4] + *(long *)(in_RDI + 8);
    }
    in_EDX = in_EDX - amt;
  }
  return;
}

Assistant:

static void vdbePmaWriteBlob(PmaWriter *p, u8 *pData, int nData){
  int nRem = nData;
  while( nRem>0 && p->eFWErr==0 ){
    int nCopy = nRem;
    if( nCopy>(p->nBuffer - p->iBufEnd) ){
      nCopy = p->nBuffer - p->iBufEnd;
    }

    memcpy(&p->aBuffer[p->iBufEnd], &pData[nData-nRem], nCopy);
    p->iBufEnd += nCopy;
    if( p->iBufEnd==p->nBuffer ){
      p->eFWErr = sqlite3OsWrite(p->pFd, 
          &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart, 
          p->iWriteOff + p->iBufStart
      );
      p->iBufStart = p->iBufEnd = 0;
      p->iWriteOff += p->nBuffer;
    }
    assert( p->iBufEnd<p->nBuffer );

    nRem -= nCopy;
  }
}